

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O0

char * __thiscall dxil_spv::CLIParser::next_string(CLIParser *this)

{
  char *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined8 uVar4;
  char *ret;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  CLIParser *this_local;
  
  if (this->argc != 0) {
    pcVar1 = *this->argv;
    this->argc = this->argc + -1;
    this->argv = this->argv + 1;
    return pcVar1;
  }
  buffer._4088_8_ = dxil_spv::get_thread_log_callback();
  if (buffer._4088_8_ == 0) {
    fprintf(_stderr,"[ERROR]: Tried to parse string, but nothing left in arguments.\n");
    fflush(_stderr);
  }
  else {
    snprintf((char *)&ret,0x1000,"Tried to parse string, but nothing left in arguments.\n");
    uVar2 = buffer._4088_8_;
    uVar4 = dxil_spv::get_thread_log_callback_userdata();
    (*(code *)uVar2)(uVar4,2,&ret);
  }
  bVar3 = std::function::operator_cast_to_bool((function *)&(this->cbs).error_handler);
  if (bVar3) {
    std::function<void_()>::operator()(&(this->cbs).error_handler);
  }
  exit(1);
}

Assistant:

const char *CLIParser::next_string()
{
	if (!argc)
	{
		LOGE("Tried to parse string, but nothing left in arguments.\n");
		if (cbs.error_handler)
			cbs.error_handler();
		exit(EXIT_FAILURE);
	}

	const char *ret = *argv;
	argc--;
	argv++;
	return ret;
}